

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

bool __thiscall trieste::wf::Sequence::check(Sequence *this,Node *node)

{
  bool bVar1;
  element_type *peVar2;
  reference node_00;
  size_t sVar3;
  Location *pLVar4;
  bool local_329;
  bool local_309;
  string local_2f0;
  size_t local_2d0;
  string local_2c8;
  Log local_2a8;
  shared_ptr<trieste::NodeDef> local_100;
  Token local_f0;
  reference local_e8;
  shared_ptr<trieste::NodeDef> *child;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  bool ok;
  bool has_err;
  Node *node_local;
  Sequence *this_local;
  
  __range2._7_1_ = false;
  __range2._6_1_ = true;
  peVar2 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)node);
  __end2._M_current = (shared_ptr<trieste::NodeDef> *)NodeDef::begin(peVar2);
  child = (shared_ptr<trieste::NodeDef> *)NodeDef::end(peVar2);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                           (&__end2,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                     *)&child), ((bVar1 ^ 0xffU) & 1) != 0) {
    node_00 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
              ::operator*(&__end2);
    local_309 = true;
    local_e8 = node_00;
    if (__range2._7_1_ == false) {
      Token::Token(&local_f0,(TokenDef *)Error);
      local_309 = trieste::operator==(node_00,&local_f0);
    }
    __range2._7_1_ = local_309;
    std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_100,local_e8);
    bVar1 = Choice::check(&this->choice,&local_100);
    local_329 = false;
    if (bVar1) {
      local_329 = __range2._6_1_;
    }
    __range2._6_1_ = local_329;
    std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_100);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
    ::operator++(&__end2);
  }
  if (__range2._7_1_ == false) {
    peVar2 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)node);
    sVar3 = NodeDef::size(peVar2);
    if (sVar3 < this->minlen) {
      local_2a8.print = Silent;
      if (1 < logging::detail::report_level) {
        logging::Log::start(&local_2a8,Error);
      }
      peVar2 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
      pLVar4 = NodeDef::location(peVar2);
      Location::origin_linecol_abi_cxx11_(&local_2c8,pLVar4);
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::append<std::__cxx11::string>(&local_2a8,&local_2c8);
      }
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::append<char[21]>(&local_2a8,(char (*) [21])": expected at least ");
      }
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::append<unsigned_long>(&local_2a8,&this->minlen);
      }
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::append<char[18]>(&local_2a8,(char (*) [18])0x394aba);
      }
      peVar2 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
      local_2d0 = NodeDef::size(peVar2);
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::append<unsigned_long>(&local_2a8,&local_2d0);
      }
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::Log::operation(&local_2a8,std::endl<char,std::char_traits<char>>);
      }
      peVar2 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
      pLVar4 = NodeDef::location(peVar2);
      Location::str_abi_cxx11_(&local_2f0,pLVar4);
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::append<std::__cxx11::string>(&local_2a8,&local_2f0);
      }
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::append<std::shared_ptr<trieste::NodeDef>>(&local_2a8,node);
      }
      bVar1 = logging::Log::is_active(&local_2a8);
      if (bVar1) {
        logging::Log::operation(&local_2a8,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2c8);
      logging::detail::LogImpl<(trieste::logging::detail::LogLevel)2>::~LogImpl
                ((LogImpl<(trieste::logging::detail::LogLevel)2> *)&local_2a8);
      __range2._6_1_ = false;
    }
  }
  return __range2._6_1_;
}

Assistant:

bool check(Node node) const
      {
        auto has_err = false;
        auto ok = true;

        for (auto& child : *node)
        {
          has_err = has_err || (child == Error);
          ok = choice.check(child) && ok;
        }

        if (!has_err && (node->size() < minlen))
        {
          logging::Error() << node->location().origin_linecol()
                           << ": expected at least " << minlen
                           << " children, found " << node->size() << std::endl
                           << node->location().str() << node << std::endl;
          ok = false;
        }

        return ok;
      }